

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O0

void Acec_ManCountXorTreeInputs_rec
               (Gia_Man_t *p,int Node,Vec_Int_t *vXors,Vec_Int_t *vXorMap,Vec_Bit_t *vIsCarryRoot,
               Vec_Int_t *vCarryRootSet,Vec_Int_t *vXorSet)

{
  int iVar1;
  int Node_00;
  int local_3c;
  int iXorBox;
  int k;
  Vec_Int_t *vCarryRootSet_local;
  Vec_Bit_t *vIsCarryRoot_local;
  Vec_Int_t *vXorMap_local;
  Vec_Int_t *vXors_local;
  int Node_local;
  Gia_Man_t *p_local;
  
  if ((Node != 0) && (iVar1 = Gia_ObjIsTravIdCurrentId(p,Node), iVar1 == 0)) {
    Gia_ObjSetTravIdCurrentId(p,Node);
    iVar1 = Vec_IntEntry(vXorMap,Node);
    if (iVar1 == -1) {
      iVar1 = Vec_BitEntry(vIsCarryRoot,Node);
      if (iVar1 != 0) {
        Vec_IntPush(vCarryRootSet,Node);
      }
    }
    else {
      for (local_3c = 1; local_3c < 4; local_3c = local_3c + 1) {
        Node_00 = Vec_IntEntry(vXors,iVar1 * 4 + local_3c);
        Acec_ManCountXorTreeInputs_rec(p,Node_00,vXors,vXorMap,vIsCarryRoot,vCarryRootSet,vXorSet);
      }
      iVar1 = Vec_IntEntry(vXors,iVar1 << 2);
      Vec_IntPush(vXorSet,iVar1);
    }
  }
  return;
}

Assistant:

void Acec_ManCountXorTreeInputs_rec( Gia_Man_t * p, int Node, Vec_Int_t * vXors, Vec_Int_t * vXorMap, Vec_Bit_t * vIsCarryRoot, Vec_Int_t * vCarryRootSet, Vec_Int_t * vXorSet )
{
    int k, iXorBox;
    if ( Node == 0 || Gia_ObjIsTravIdCurrentId(p, Node) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Node);
    iXorBox = Vec_IntEntry( vXorMap, Node );
    if ( iXorBox == -1 )
    {
        if ( Vec_BitEntry(vIsCarryRoot, Node) )
            Vec_IntPush( vCarryRootSet, Node );
        return;
    }
    for ( k = 1; k < 4; k++ )
        Acec_ManCountXorTreeInputs_rec( p, Vec_IntEntry(vXors, 4*iXorBox+k), vXors, vXorMap, vIsCarryRoot, vCarryRootSet, vXorSet );
    Vec_IntPush( vXorSet, Vec_IntEntry(vXors, 4*iXorBox) );
}